

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool detect_monsters(wchar_t y_dist,wchar_t x_dist,monster_predicate pred)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  wchar_t wVar4;
  _Bool _Var5;
  _Bool _Var6;
  wchar_t wVar7;
  wchar_t wVar8;
  monster_conflict *mon;
  monster_lore *pmVar9;
  wchar_t wVar10;
  wchar_t wVar11;
  wchar_t wVar12;
  wchar_t wVar13;
  
  iVar2 = (player->grid).x;
  iVar3 = (player->grid).y;
  wVar13 = iVar3 - y_dist;
  wVar7 = iVar3 + y_dist;
  wVar12 = iVar2 - x_dist;
  wVar10 = iVar2 + x_dist;
  _Var6 = false;
  if (wVar13 < L'\x01') {
    wVar13 = L'\0';
  }
  if (wVar12 < L'\x01') {
    wVar12 = L'\0';
  }
  wVar11 = cave->height + L'\xffffffff';
  if (wVar7 < cave->height) {
    wVar11 = wVar7;
  }
  wVar7 = cave->width + L'\xffffffff';
  if (wVar10 < cave->width) {
    wVar7 = wVar10;
  }
  wVar10 = L'\x01';
  while( true ) {
    wVar8 = cave_monster_max(cave);
    if (wVar8 <= wVar10) break;
    mon = (monster_conflict *)cave_monster(cave,wVar10);
    if ((mon->race != (monster_race *)0x0) && (wVar8 = (mon->grid).x, wVar12 <= wVar8)) {
      wVar4 = (mon->grid).y;
      if ((wVar13 <= wVar4) && ((wVar8 <= wVar7 && (wVar4 <= wVar11)))) {
        _Var5 = (*pred)((monster *)mon);
        if (_Var5) {
          _Var5 = monster_is_camouflaged((monster *)mon);
          if (!_Var5) {
            flag_on_dbg(mon->mflag,2,5,"mon->mflag","MFLAG_MARK");
            flag_on_dbg(mon->mflag,2,4,"mon->mflag","MFLAG_SHOW");
            _Var6 = monster_is_invisible((monster *)mon);
            if (_Var6) {
              pmVar9 = get_lore(mon->race);
              flag_on_dbg(pmVar9->flags,0xb,0x28,"lore->flags","RF_INVISIBLE");
            }
            if (player->upkeep->monster_race == mon->race) {
              pbVar1 = (byte *)((long)&player->upkeep->redraw + 2);
              *pbVar1 = *pbVar1 | 0x10;
            }
            update_mon(mon,(chunk *)cave,false);
            _Var6 = true;
          }
        }
      }
    }
    wVar10 = wVar10 + L'\x01';
  }
  return _Var6;
}

Assistant:

static bool detect_monsters(int y_dist, int x_dist, monster_predicate pred)
{
	int i, x, y;
	int x1, x2, y1, y2;

	bool monsters = false;

	/* Set the detection area */
	y1 = player->grid.y - y_dist;
	y2 = player->grid.y + y_dist;
	x1 = player->grid.x - x_dist;
	x2 = player->grid.x + x_dist;

	if (y1 < 0) y1 = 0;
	if (x1 < 0) x1 = 0;
	if (y2 > cave->height - 1) y2 = cave->height - 1;
	if (x2 > cave->width - 1) x2 = cave->width - 1;

	/* Scan monsters */
	for (i = 1; i < cave_monster_max(cave); i++) {
		struct monster *mon = cave_monster(cave, i);

		/* Skip dead monsters */
		if (!mon->race) continue;

		/* Location */
		y = mon->grid.y;
		x = mon->grid.x;

		/* Only detect nearby monsters */
		if (x < x1 || y < y1 || x > x2 || y > y2) continue;

		/* Detect all appropriate, obvious monsters */
		if (pred(mon) && !monster_is_camouflaged(mon)) {
			/* Detect the monster */
			mflag_on(mon->mflag, MFLAG_MARK);
			mflag_on(mon->mflag, MFLAG_SHOW);

			/* Note invisible monsters */
			if (monster_is_invisible(mon)) {
				struct monster_lore *lore = get_lore(mon->race);
				rf_on(lore->flags, RF_INVISIBLE);
			}

			/* Update monster recall window */
			if (player->upkeep->monster_race == mon->race)
				/* Redraw stuff */
				player->upkeep->redraw |= (PR_MONSTER);

			/* Update the monster */
			update_mon(mon, cave, false);

			/* Detect */
			monsters = true;
		}
	}

	return monsters;
}